

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O0

void test_recompose<float>
               (vector<float,_std::allocator<float>_> *data,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,int target_level)

{
  ostream *poVar1;
  Recomposer<float> *this;
  Recomposer<float> recomposer;
  int err;
  timespec end;
  timespec start;
  undefined4 in_stack_000000f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  timespec local_38;
  timespec local_28 [2];
  
  clock_gettime(0,local_28);
  MGARD::Recomposer<float>::Recomposer((Recomposer<float> *)0x10c5e5);
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x10c5f2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10c631);
  MGARD::Recomposer<float>::recompose
            ((Recomposer<float> *)data,(float *)dims,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(target_level,in_stack_000000f0),start.tv_nsec,start.tv_sec._7_1_,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)end.tv_nsec);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10);
  clock_gettime(0,&local_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"Recomposition time: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(double)(local_38.tv_sec - local_28[0].tv_sec) +
                             (double)(local_38.tv_nsec - local_28[0].tv_nsec) / 1000000000.0);
  this = (Recomposer<float> *)std::operator<<(poVar1,"s");
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  MGARD::Recomposer<float>::~Recomposer(this);
  return;
}

Assistant:

void test_recompose(vector<T>& data, const vector<size_t>& dims, int target_level){
    struct timespec start, end;
    int err = 0;
    err = clock_gettime(CLOCK_REALTIME, &start);
    MGARD::Recomposer<T> recomposer;
    recomposer.recompose(data.data(), dims, target_level);
    err = clock_gettime(CLOCK_REALTIME, &end);
    cout << "Recomposition time: " << (double)(end.tv_sec - start.tv_sec) + (double)(end.tv_nsec - start.tv_nsec)/(double)1000000000 << "s" << endl;
}